

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

int ncnn::gru(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Mat *in_RCX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  Mat *in_R8;
  Mat *in_R9;
  float fVar10;
  double dVar11;
  double dVar12;
  Mat *in_stack_00000008;
  float H;
  float N_1;
  float U_1;
  float *gates_data_1;
  int q_1;
  float *output_data;
  float xi_1;
  int i_3;
  float h_cont_1;
  int i_2;
  float N;
  float *weight_hc_N;
  float *weight_xc_N;
  float *bias_c_BN;
  float *bias_c_WN;
  float h_cont;
  int i_1;
  float xi;
  int i;
  float U;
  float R;
  float *weight_hc_U;
  float *weight_hc_R;
  float *weight_xc_U;
  float *weight_xc_R;
  float *bias_c_U;
  float *bias_c_R;
  float *gates_data;
  int q;
  float *x;
  int ti;
  int t;
  Mat gates;
  int num_output;
  int T;
  int size;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  float fVar13;
  Mat *in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  Mat *in_stack_fffffffffffffdf0;
  int local_174;
  int local_14c;
  int local_138;
  int local_130;
  float local_12c;
  int local_104;
  int local_fc;
  float local_f8;
  float local_f4;
  int local_b4;
  int local_a4;
  Mat local_90;
  int local_44;
  int local_40;
  int local_3c;
  Mat *local_38;
  Mat *local_30;
  Mat *local_28;
  int local_1c;
  Mat *local_18;
  Mat *local_10;
  int local_4;
  
  local_3c = in_RDI->w;
  local_40 = in_RDI->h;
  local_44 = in_RSI->w;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  Mat::Mat(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,
           (size_t)in_stack_fffffffffffffde0,
           (Allocator *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  bVar1 = Mat::empty(in_stack_fffffffffffffde0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    for (local_a4 = 0; local_a4 < local_40; local_a4 = local_a4 + 1) {
      if (local_1c == 0) {
        local_174 = local_a4;
      }
      else {
        local_174 = (local_40 + -1) - local_a4;
      }
      pfVar2 = Mat::row(local_10,local_174);
      for (local_b4 = 0; local_b4 < local_44; local_b4 = local_b4 + 1) {
        pfVar3 = Mat::row(&local_90,local_b4);
        pfVar4 = Mat::row(local_30,0);
        pfVar5 = Mat::row(local_30,1);
        pfVar6 = Mat::row(local_28,local_b4);
        pfVar7 = Mat::row(local_28,local_44 + local_b4);
        pfVar8 = Mat::row(local_38,local_b4);
        pfVar9 = Mat::row(local_38,local_44 + local_b4);
        local_f4 = pfVar4[local_b4];
        local_f8 = pfVar5[local_b4];
        for (local_fc = 0; local_fc < local_3c; local_fc = local_fc + 1) {
          local_f4 = pfVar6[local_fc] * pfVar2[local_fc] + local_f4;
          local_f8 = pfVar7[local_fc] * pfVar2[local_fc] + local_f8;
        }
        for (local_104 = 0; local_104 < local_44; local_104 = local_104 + 1) {
          pfVar4 = Mat::operator[](in_stack_00000008,(long)local_104);
          local_f4 = pfVar8[local_104] * *pfVar4 + local_f4;
          local_f8 = pfVar9[local_104] * *pfVar4 + local_f8;
        }
        dVar11 = std::exp((double)((ulong)(uint)local_f4 ^ 0x8000000080000000));
        dVar12 = std::exp((double)((ulong)(uint)local_f8 ^ 0x8000000080000000));
        pfVar4 = Mat::row(local_30,2);
        pfVar5 = Mat::row(local_30,3);
        pfVar6 = Mat::row(local_28,local_b4 + local_44 * 2);
        pfVar7 = Mat::row(local_38,local_b4 + local_44 * 2);
        local_12c = pfVar5[local_b4];
        for (local_130 = 0; local_130 < local_44; local_130 = local_130 + 1) {
          pfVar5 = Mat::operator[](in_stack_00000008,(long)local_130);
          local_12c = pfVar7[local_130] * *pfVar5 + local_12c;
        }
        local_12c = pfVar4[local_b4] + (1.0 / (SUB84(dVar11,0) + 1.0)) * local_12c;
        for (local_138 = 0; local_138 < local_3c; local_138 = local_138 + 1) {
          local_12c = pfVar6[local_138] * pfVar2[local_138] + local_12c;
        }
        dVar11 = std::tanh((double)(ulong)(uint)local_12c);
        *pfVar3 = 1.0 / (SUB84(dVar12,0) + 1.0);
        pfVar3[1] = SUB84(dVar11,0);
      }
      pfVar2 = Mat::row(local_18,local_174);
      for (local_14c = 0; local_14c < local_44; local_14c = local_14c + 1) {
        pfVar3 = Mat::row(&local_90,local_14c);
        fVar13 = *pfVar3;
        fVar10 = (1.0 - fVar13) * pfVar3[1];
        pfVar3 = Mat::operator[](in_stack_00000008,(long)local_14c);
        fVar10 = fVar10 + fVar13 * *pfVar3;
        fVar13 = fVar10;
        pfVar3 = Mat::operator[](in_stack_00000008,(long)local_14c);
        *pfVar3 = fVar13;
        pfVar2[local_14c] = fVar10;
      }
    }
    local_4 = 0;
  }
  Mat::~Mat((Mat *)0x90f65f);
  return local_4;
}

Assistant:

static int gru(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 2 x num_output
    Mat gates(2, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            float* gates_data = gates.row(q);

            // gate reset update
            const float* bias_c_R = bias_c.row(0);
            const float* bias_c_U = bias_c.row(1);

            const float* weight_xc_R = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_U = weight_xc.row(num_output * 1 + q);
            const float* weight_hc_R = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_U = weight_hc.row(num_output * 1 + q);

            float R = bias_c_R[q];
            float U = bias_c_U[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                R += weight_xc_R[i] * xi;
                U += weight_xc_U[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                R += weight_hc_R[i] * h_cont;
                U += weight_hc_U[i] * h_cont;
            }

            // sigmoid(R)
            // sigmoid(U)
            R = 1.f / (1.f + exp(-R));
            U = 1.f / (1.f + exp(-U));

            // gate new
            const float* bias_c_WN = bias_c.row(2);
            const float* bias_c_BN = bias_c.row(3);

            const float* weight_xc_N = weight_xc.row(num_output * 2 + q);
            const float* weight_hc_N = weight_hc.row(num_output * 2 + q);

            float N = bias_c_BN[q];

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                N += weight_hc_N[i] * h_cont;
            }

            N = bias_c_WN[q] + R * N;

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                N += weight_xc_N[i] * xi;
            }

            // tanh(N)
            N = tanh(N);

            gates_data[0] = U;
            gates_data[1] = N;
        }

        // h_t := (1 - update) .* new + update .* h_{t-1}
        float* output_data = top_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float U = gates_data[0];
            float N = gates_data[1];

            float H = (1 - U) * N + U * hidden_state[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}